

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

bool __thiscall OpenMD::ZConstraintForceModifier::checkZConsState(ZConstraintForceModifier *this)

{
  double dVar1;
  bool bVar2;
  pointer pZVar3;
  long in_RDI;
  RealType RVar4;
  Vector3d d_1;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> newFixedZMols;
  RealType diff_1;
  Vector3d d;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> newMovingZMols;
  iterator j;
  iterator i;
  int changed;
  RealType diff;
  Vector3d com;
  Vector<double,_3U> *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  byte bVar5;
  const_iterator in_stack_fffffffffffffda8;
  Vector3<double> *in_stack_fffffffffffffdb0;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *in_stack_fffffffffffffdf0;
  _List_iterator<OpenMD::ZconstraintMol> in_stack_fffffffffffffdf8;
  _List_iterator<OpenMD::ZconstraintMol> in_stack_fffffffffffffe00;
  const_iterator in_stack_fffffffffffffe08;
  Vector3d *in_stack_fffffffffffffe18;
  Snapshot *in_stack_fffffffffffffe20;
  iterator local_1d0;
  _List_const_iterator<OpenMD::ZconstraintMol> local_1c8;
  _List_node_base *local_1c0;
  _List_node_base *local_1b8;
  _List_node_base *local_1b0;
  iterator local_1a8;
  _List_const_iterator<OpenMD::ZconstraintMol> local_1a0;
  _List_node_base *local_198;
  _List_const_iterator<OpenMD::ZconstraintMol> local_190;
  _List_node_base *local_188;
  Vector<double,_3U> local_150 [2];
  _Self local_120;
  _List_node_base *local_118;
  _List_node_base *local_f8;
  _List_const_iterator<OpenMD::ZconstraintMol> local_f0;
  _List_node_base *local_e8;
  double local_e0;
  Vector<double,_3U> local_a8 [2];
  _Self local_68;
  _List_node_base *local_60;
  _List_iterator<OpenMD::ZconstraintMol> local_40;
  _List_iterator<OpenMD::ZconstraintMol> local_38;
  int local_2c;
  double local_28;
  
  Vector3<double>::Vector3((Vector3<double> *)0x177789);
  local_2c = 0;
  std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator(&local_38);
  std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator(&local_40);
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x1777bb);
  local_60 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   in_stack_fffffffffffffd98);
  local_38._M_node = local_60;
  while( true ) {
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffd98);
    bVar2 = std::operator!=(&local_38,&local_68);
    if (!bVar2) break;
    std::_List_iterator<OpenMD::ZconstraintMol>::operator->
              ((_List_iterator<OpenMD::ZconstraintMol> *)0x177822);
    Molecule::getCom((Molecule *)in_stack_fffffffffffffdf8._M_node);
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (Vector3<double> *)in_stack_fffffffffffffd98);
    std::_List_iterator<OpenMD::ZconstraintMol>::operator->
              ((_List_iterator<OpenMD::ZconstraintMol> *)0x177858);
    Vector3<double>::Vector3
              (in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8._M_node,
               (double)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (double)in_stack_fffffffffffffd98);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffda8._M_node,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    Vector3<double>::Vector3
              ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    Snapshot::wrapVector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe08._M_node =
         (_List_node_base *)Vector<double,_3U>::operator[](local_a8,2);
    local_e0 = ABS((double)(in_stack_fffffffffffffe08._M_node)->_M_next);
    if (local_e0 < *(double *)(in_RDI + 0x80) || local_e0 == *(double *)(in_RDI + 0x80)) {
      std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_38);
    }
    else {
      if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
        in_stack_fffffffffffffe00._M_node = *(_List_node_base **)(in_RDI + 0x108);
        pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                           ((_List_iterator<OpenMD::ZconstraintMol> *)0x177943);
        pZVar3->endFixingTime = (RealType)in_stack_fffffffffffffe00._M_node;
      }
      local_e8 = (_List_node_base *)
                 std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_38,0);
      local_40._M_node = local_e8;
      std::_List_iterator<OpenMD::ZconstraintMol>::operator*
                ((_List_iterator<OpenMD::ZconstraintMol> *)0x17799d);
      std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::push_back
                ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                 in_stack_fffffffffffffdb0,(value_type *)in_stack_fffffffffffffda8._M_node);
      in_stack_fffffffffffffdf8._M_node = (_List_node_base *)(in_RDI + 0x28);
      std::_List_const_iterator<OpenMD::ZconstraintMol>::_List_const_iterator(&local_f0,&local_40);
      local_f8 = (_List_node_base *)
                 std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
                 ::erase((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                         CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                         in_stack_fffffffffffffda8);
      local_2c = 1;
    }
  }
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x177a18);
  local_118 = (_List_node_base *)
              std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
              begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffd98);
  local_38._M_node = local_118;
  while( true ) {
    local_120._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffd98);
    bVar2 = std::operator!=(&local_38,&local_120);
    if (!bVar2) break;
    std::_List_iterator<OpenMD::ZconstraintMol>::operator->
              ((_List_iterator<OpenMD::ZconstraintMol> *)0x177a7f);
    Molecule::getCom((Molecule *)in_stack_fffffffffffffdf8._M_node);
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (Vector3<double> *)in_stack_fffffffffffffd98);
    std::_List_iterator<OpenMD::ZconstraintMol>::operator->
              ((_List_iterator<OpenMD::ZconstraintMol> *)0x177ab5);
    Vector3<double>::Vector3
              (in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8._M_node,
               (double)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (double)in_stack_fffffffffffffd98);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffda8._M_node,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    Vector3<double>::Vector3
              ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    Snapshot::wrapVector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffdf0 =
         (list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
         Vector<double,_3U>::operator[](local_150,2);
    local_28 = ABS((double)(in_stack_fffffffffffffdf0->
                           super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
                           )._M_impl._M_node.super__List_node_base._M_next);
    if (*(double *)(in_RDI + 0x80) < local_28) {
      std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_38);
    }
    else {
      if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
        RVar4 = Snapshot::getTime(*(Snapshot **)(in_RDI + 0xe0));
        dVar1 = *(double *)(in_RDI + 0x90);
        pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                           ((_List_iterator<OpenMD::ZconstraintMol> *)0x177bc3);
        pZVar3->endFixingTime = RVar4 + dVar1;
      }
      local_188 = (_List_node_base *)
                  std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_38,0);
      local_40._M_node = local_188;
      std::_List_iterator<OpenMD::ZconstraintMol>::operator*
                ((_List_iterator<OpenMD::ZconstraintMol> *)0x177c2a);
      std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::push_back
                ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                 in_stack_fffffffffffffdb0,(value_type *)in_stack_fffffffffffffda8._M_node);
      std::_List_const_iterator<OpenMD::ZconstraintMol>::_List_const_iterator(&local_190,&local_40);
      local_198 = (_List_node_base *)
                  std::__cxx11::
                  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::erase
                            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
                              *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                             in_stack_fffffffffffffda8);
      local_2c = 1;
    }
  }
  local_1a8._M_node =
       (_List_node_base *)
       std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                 ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                  in_stack_fffffffffffffd98);
  std::_List_const_iterator<OpenMD::ZconstraintMol>::_List_const_iterator(&local_1a0,&local_1a8);
  local_1b0 = (_List_node_base *)
              std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
              begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffd98);
  local_1b8 = (_List_node_base *)
              std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
              end((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                  in_stack_fffffffffffffd98);
  local_1c0 = (_List_node_base *)
              std::__cxx11::list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>>::
              insert<std::_List_iterator<OpenMD::ZconstraintMol>,void>
                        (in_stack_fffffffffffffdf0,in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_1d0._M_node =
       (_List_node_base *)
       std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                 ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                  in_stack_fffffffffffffd98);
  std::_List_const_iterator<OpenMD::ZconstraintMol>::_List_const_iterator(&local_1c8,&local_1d0);
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::begin
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
             in_stack_fffffffffffffd98);
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
             in_stack_fffffffffffffd98);
  std::__cxx11::list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>>::
  insert<std::_List_iterator<OpenMD::ZconstraintMol>,void>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  bVar5 = 0 < local_2c;
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::~list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x177dd8);
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::~list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x177de5);
  return (bool)(bVar5 & 1);
}

Assistant:

bool ZConstraintForceModifier::checkZConsState() {
    Vector3d com;
    RealType diff;
    int changed = 0;

    std::list<ZconstraintMol>::iterator i;
    std::list<ZconstraintMol>::iterator j;

    std::list<ZconstraintMol> newMovingZMols;
    for (i = fixedZMols_.begin(); i != fixedZMols_.end();) {
      com        = i->mol->getCom();
      Vector3d d = com - Vector3d(0.0, 0.0, i->param.zTargetPos);
      currSnapshot_->wrapVector(d);

      RealType diff = fabs(d[whichDirection]);

      if (diff > zconsTol_) {
        if (usingZconsGap_) { i->endFixingTime = infiniteTime; }
        j = i++;
        newMovingZMols.push_back(*j);
        fixedZMols_.erase(j);
        changed = 1;
      } else {
        ++i;
      }
    }

    std::list<ZconstraintMol> newFixedZMols;
    for (i = movingZMols_.begin(); i != movingZMols_.end();) {
      com        = i->mol->getCom();
      Vector3d d = com - Vector3d(0.0, 0.0, i->param.zTargetPos);
      currSnapshot_->wrapVector(d);
      diff = fabs(d[whichDirection]);

      if (diff <= zconsTol_) {
        if (usingZconsGap_) {
          i->endFixingTime = currSnapshot_->getTime() + zconsFixingTime_;
        }
        // This moving zconstraint molecule is now fixed
        j = i++;
        newFixedZMols.push_back(*j);
        movingZMols_.erase(j);
        changed = 1;
      } else {
        ++i;
      }
    }

    // merge the lists
    fixedZMols_.insert(fixedZMols_.end(), newFixedZMols.begin(),
                       newFixedZMols.end());
    movingZMols_.insert(movingZMols_.end(), newMovingZMols.begin(),
                        newMovingZMols.end());

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &changed, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#endif

    return (changed > 0);
  }